

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

string * __thiscall
File::utf8TextInRange_abi_cxx11_(string *__return_storage_ptr__,File *this,Range *range)

{
  u16string local_38;
  
  TextBuffer::text_in_range_abi_cxx11_(&local_38,&this->buffer,*range);
  UtfHandler::utf16to8(__return_storage_ptr__,&this->utf,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity * 2 + 2);
  }
  return __return_storage_ptr__;
}

Assistant:

string File::utf8TextInRange (const Range &range) {
    return utf.utf16to8(buffer.text_in_range(range));
}